

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsStateChangePerfTestCases.cpp
# Opt level: O0

void __thiscall deqp::gls::StateChangePerformanceCase::deinit(StateChangePerformanceCase *this)

{
  code *pcVar1;
  ShaderProgram *this_00;
  bool bVar2;
  int iVar3;
  undefined4 extraout_var;
  size_type sVar5;
  reference pvVar6;
  reference ppSVar7;
  int local_1c;
  int programNdx;
  Functions *gl;
  StateChangePerformanceCase *this_local;
  long lVar4;
  
  std::vector<unsigned_short,_std::allocator<unsigned_short>_>::clear(&this->m_indices);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::clear(&this->m_interleavedResults);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::clear(&this->m_batchedResults);
  iVar3 = (*this->m_renderCtx->_vptr_RenderContext[3])();
  lVar4 = CONCAT44(extraout_var,iVar3);
  bVar2 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::empty(&this->m_indexBuffers);
  if (!bVar2) {
    pcVar1 = *(code **)(lVar4 + 0x438);
    sVar5 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size(&this->m_indexBuffers);
    pvVar6 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                       (&this->m_indexBuffers,0);
    (*pcVar1)(sVar5 & 0xffffffff,pvVar6);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::clear(&this->m_indexBuffers);
  }
  bVar2 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::empty(&this->m_coordBuffers);
  if (!bVar2) {
    pcVar1 = *(code **)(lVar4 + 0x438);
    sVar5 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size(&this->m_coordBuffers);
    pvVar6 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                       (&this->m_coordBuffers,0);
    (*pcVar1)(sVar5 & 0xffffffff,pvVar6);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::clear(&this->m_coordBuffers);
  }
  bVar2 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::empty(&this->m_textures);
  if (!bVar2) {
    pcVar1 = *(code **)(lVar4 + 0x480);
    sVar5 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size(&this->m_textures);
    pvVar6 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                       (&this->m_textures,0);
    (*pcVar1)(sVar5 & 0xffffffff,pvVar6);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::clear(&this->m_textures);
  }
  bVar2 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::empty(&this->m_framebuffers);
  if (!bVar2) {
    pcVar1 = *(code **)(lVar4 + 0x440);
    sVar5 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size(&this->m_framebuffers);
    pvVar6 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                       (&this->m_framebuffers,0);
    (*pcVar1)(sVar5 & 0xffffffff,pvVar6);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::clear(&this->m_framebuffers);
  }
  bVar2 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::empty(&this->m_renderbuffers);
  if (!bVar2) {
    pcVar1 = *(code **)(lVar4 + 0x460);
    sVar5 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size(&this->m_renderbuffers);
    pvVar6 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                       (&this->m_renderbuffers,0);
    (*pcVar1)(sVar5 & 0xffffffff,pvVar6);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::clear(&this->m_renderbuffers);
  }
  bVar2 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::empty(&this->m_samplers);
  if (!bVar2) {
    pcVar1 = *(code **)(lVar4 + 0x468);
    sVar5 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size(&this->m_samplers);
    pvVar6 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                       (&this->m_samplers,0);
    (*pcVar1)(sVar5 & 0xffffffff,pvVar6);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::clear(&this->m_samplers);
  }
  bVar2 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::empty(&this->m_vertexArrays);
  if (!bVar2) {
    pcVar1 = *(code **)(lVar4 + 0x490);
    sVar5 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size(&this->m_vertexArrays);
    pvVar6 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                       (&this->m_vertexArrays,0);
    (*pcVar1)(sVar5 & 0xffffffff,pvVar6);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::clear(&this->m_vertexArrays);
  }
  local_1c = 0;
  while( true ) {
    sVar5 = std::vector<glu::ShaderProgram_*,_std::allocator<glu::ShaderProgram_*>_>::size
                      (&this->m_programs);
    if ((int)sVar5 <= local_1c) break;
    ppSVar7 = std::vector<glu::ShaderProgram_*,_std::allocator<glu::ShaderProgram_*>_>::operator[]
                        (&this->m_programs,(long)local_1c);
    this_00 = *ppSVar7;
    if (this_00 != (ShaderProgram *)0x0) {
      glu::ShaderProgram::~ShaderProgram(this_00);
      operator_delete(this_00,0xd0);
    }
    ppSVar7 = std::vector<glu::ShaderProgram_*,_std::allocator<glu::ShaderProgram_*>_>::operator[]
                        (&this->m_programs,(long)local_1c);
    *ppSVar7 = (value_type)0x0;
    local_1c = local_1c + 1;
  }
  std::vector<glu::ShaderProgram_*,_std::allocator<glu::ShaderProgram_*>_>::clear(&this->m_programs)
  ;
  return;
}

Assistant:

void StateChangePerformanceCase::deinit (void)
{
	m_indices.clear();
	m_interleavedResults.clear();
	m_batchedResults.clear();

	{
		const glw::Functions& gl = m_renderCtx.getFunctions();

		if (!m_indexBuffers.empty())
		{
			gl.deleteBuffers((GLsizei)m_indexBuffers.size(), &(m_indexBuffers[0]));
			m_indexBuffers.clear();
		}

		if (!m_coordBuffers.empty())
		{
			gl.deleteBuffers((GLsizei)m_coordBuffers.size(), &(m_coordBuffers[0]));
			m_coordBuffers.clear();
		}

		if (!m_textures.empty())
		{
			gl.deleteTextures((GLsizei)m_textures.size(), &(m_textures[0]));
			m_textures.clear();
		}

		if (!m_framebuffers.empty())
		{
			gl.deleteFramebuffers((GLsizei)m_framebuffers.size(), &(m_framebuffers[0]));
			m_framebuffers.clear();
		}

		if (!m_renderbuffers.empty())
		{
			gl.deleteRenderbuffers((GLsizei)m_renderbuffers.size(), &(m_renderbuffers[0]));
			m_renderbuffers.clear();
		}

		if (!m_samplers.empty())
		{
			gl.deleteSamplers((GLsizei)m_samplers.size(), &m_samplers[0]);
			m_samplers.clear();
		}

		if (!m_vertexArrays.empty())
		{
			gl.deleteVertexArrays((GLsizei)m_vertexArrays.size(), &m_vertexArrays[0]);
			m_vertexArrays.clear();
		}

		for (int programNdx = 0; programNdx < (int)m_programs.size(); programNdx++)
		{
			delete m_programs[programNdx];
			m_programs[programNdx] = NULL;
		}
		m_programs.clear();
	}
}